

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzip_test.cpp
# Opt level: O2

void __thiscall unit_test::unit_test(unit_test *this,service *s)

{
  url_dispatcher *puVar1;
  allocator local_31;
  string local_30;
  
  cppcms::application::application(&this->super_application,s);
  *(undefined ***)this = &PTR__application_00109bf8;
  puVar1 = (url_dispatcher *)cppcms::application::dispatcher();
  std::__cxx11::string::string((string *)&local_30,"/ca",&local_31);
  cppcms::url_dispatcher::assign<unit_test>(puVar1,&local_30,0x1058ae,(unit_test *)0x0);
  std::__cxx11::string::~string((string *)&local_30);
  puVar1 = (url_dispatcher *)cppcms::application::dispatcher();
  std::__cxx11::string::string((string *)&local_30,"/cb",&local_31);
  cppcms::url_dispatcher::assign<unit_test>(puVar1,&local_30,0x1058cc,(unit_test *)0x0);
  std::__cxx11::string::~string((string *)&local_30);
  puVar1 = (url_dispatcher *)cppcms::application::dispatcher();
  std::__cxx11::string::string((string *)&local_30,"/cbig",&local_31);
  cppcms::url_dispatcher::assign<unit_test>(puVar1,&local_30,0x1058fe,(unit_test *)0x0);
  std::__cxx11::string::~string((string *)&local_30);
  puVar1 = (url_dispatcher *)cppcms::application::dispatcher();
  std::__cxx11::string::string((string *)&local_30,"/bin",&local_31);
  cppcms::url_dispatcher::assign<unit_test>(puVar1,&local_30,0x105972,(unit_test *)0x0);
  std::__cxx11::string::~string((string *)&local_30);
  puVar1 = (url_dispatcher *)cppcms::application::dispatcher();
  std::__cxx11::string::string((string *)&local_30,"/not",&local_31);
  cppcms::url_dispatcher::assign<unit_test>(puVar1,&local_30,0x1059f2,(unit_test *)0x0);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

unit_test(cppcms::service &s) : cppcms::application(s)
	{
		dispatcher().assign("/ca",&unit_test::compressed_a,this);
		dispatcher().assign("/cb",&unit_test::compressed_b,this);
		dispatcher().assign("/cbig",&unit_test::compressed_big,this);
		dispatcher().assign("/bin",&unit_test::binary,this);
		dispatcher().assign("/not",&unit_test::not_compressed,this);
	}